

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::fillAreaFrac(Level *this,Array<MultiCutFab_*,_3> *a_areafrac,Geometry *geom)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference ppMVar5;
  FabArray<amrex::FArrayBox> *src;
  BaseFab<double> *pBVar6;
  Level *in_RDI;
  Periodicity PVar7;
  Box bx_1;
  Box *fbx;
  int idim_2;
  pair<int,_amrex::Box> *is;
  iterator __end6;
  iterator __begin6;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range6;
  IntVect *iv;
  const_iterator __end5;
  const_iterator __begin5;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range5;
  Array4<double> *apz;
  Array4<double> *apy;
  Array4<double> *apx;
  Box bx;
  Box *ccbx;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  MultiFab tmp;
  MultiCutFab *areafrac;
  int idim_1;
  int idim;
  int i;
  MFIter *in_stack_fffffffffffffa58;
  FabFactory<amrex::FArrayBox> *factory;
  MultiCutFab *in_stack_fffffffffffffa60;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_fffffffffffffa70;
  undefined1 *puVar8;
  MFInfo *in_stack_fffffffffffffa80;
  uchar flags_;
  Box *bx_00;
  FabArrayBase *in_stack_fffffffffffffa88;
  double *x;
  Geometry *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 uVar9;
  int in_stack_fffffffffffffa9c;
  BoxArray *in_stack_fffffffffffffaa0;
  FabFactory<amrex::FArrayBox> *pFVar10;
  BoxArray *in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffae0;
  Periodicity *in_stack_fffffffffffffae8;
  CpOp in_stack_fffffffffffffaf0;
  uint local_500;
  undefined1 local_4fc [12];
  int aiStack_4f0 [3];
  undefined1 local_4e4 [4];
  undefined1 *local_4e0;
  int local_4d4;
  reference local_4d0;
  pair<int,_amrex::Box> *local_4c8;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_4c0;
  undefined1 *local_4b8;
  double local_4ac [3];
  reference local_490;
  IntVect *local_488;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_480;
  undefined1 *local_478;
  Real in_stack_fffffffffffffb90;
  MultiCutFab *in_stack_fffffffffffffb98;
  MultiFab *in_stack_fffffffffffffbc0;
  MultiCutFab *in_stack_fffffffffffffbc8;
  undefined1 local_428 [64];
  undefined1 *local_3e8;
  undefined1 local_3e0 [64];
  undefined1 *local_3a0;
  undefined1 local_394 [36];
  MFIter local_370;
  undefined1 local_310 [24];
  IntVect local_2f8;
  undefined8 local_2e4;
  int local_2dc;
  undefined1 local_2d8 [24];
  undefined1 *local_2c0;
  IntVect local_2b8;
  undefined1 local_2a8 [456];
  value_type local_e0;
  int local_d8;
  int local_d4;
  int local_b4;
  undefined1 *local_b0;
  Box *local_a8;
  int local_9c;
  undefined1 *local_98;
  int local_8c;
  undefined1 *local_88;
  undefined4 local_80;
  int local_7c;
  int *local_78;
  int local_6c;
  undefined1 *local_68;
  int local_60;
  int local_5c;
  undefined1 *local_58;
  int local_50;
  int local_4c;
  BaseFab<double> *local_48;
  int local_3c;
  undefined1 *local_38;
  undefined4 local_30;
  int local_2c;
  undefined1 *local_28;
  int local_1c;
  undefined1 *local_18;
  int local_c;
  undefined1 *local_8;
  
  bVar2 = isAllRegular(in_RDI);
  if (bVar2) {
    for (local_d4 = 0; local_d4 < 3; local_d4 = local_d4 + 1) {
      std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                 (size_type)in_stack_fffffffffffffa58);
      MultiCutFab::setVal(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    }
  }
  else {
    for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
      ppMVar5 = std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                          ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                           (size_type)in_stack_fffffffffffffa58);
      local_e0 = *ppMVar5;
      in_stack_fffffffffffffab8 = MultiCutFab::boxArray((MultiCutFab *)0x14a5162);
      src = (FabArray<amrex::FArrayBox> *)MultiCutFab::DistributionMap((MultiCutFab *)0x14a5174);
      iVar3 = MultiCutFab::nComp((MultiCutFab *)0x14a5186);
      iVar4 = MultiCutFab::nGrow((MultiCutFab *)0x14a5197);
      local_2a8._48_8_ = 0;
      local_2a8._56_8_ = 0;
      local_2a8._32_8_ = 0;
      local_2a8._40_8_ = 0;
      local_2a8._64_8_ = 0;
      MFInfo::MFInfo((MFInfo *)0x14a51cc);
      local_2a8._24_8_ = 0;
      factory = (FabFactory<amrex::FArrayBox> *)(local_2a8 + 0x18);
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa60);
      pFVar10 = factory;
      MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffaa0,
                         (BoxArray *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                         (DistributionMapping *)in_stack_fffffffffffffa90,
                         (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),
                         (int)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,factory);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x14a5229);
      MFInfo::~MFInfo((MFInfo *)0x14a5236);
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa60,(value_type)factory);
      in_stack_fffffffffffffaa0 =
           (BoxArray *)
           std::array<amrex::MultiFab,_3UL>::operator[]
                     ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffa60,(size_type)factory);
      uVar9 = (undefined4)((ulong)factory >> 0x20);
      MultiCutFab::nComp((MultiCutFab *)0x14a527b);
      in_stack_fffffffffffffa9c = MultiCutFab::nGrow((MultiCutFab *)0x14a528c);
      PVar7 = Geometry::periodicity(in_stack_fffffffffffffa90);
      local_2b8.vect[2] = PVar7.period.vect[2];
      local_2a8._8_4_ = local_2b8.vect[2];
      local_2b8.vect._0_8_ = PVar7.period.vect._0_8_;
      local_2a8._0_4_ = local_2b8.vect[0];
      local_2a8._4_4_ = local_2b8.vect[1];
      in_stack_fffffffffffffa60 = (MultiCutFab *)local_2a8;
      in_stack_fffffffffffffa58 = (MFIter *)CONCAT44(uVar9,in_stack_fffffffffffffa9c);
      local_2b8 = PVar7.period.vect;
      FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)CONCAT44(iVar4,iVar3),src,
                 (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),(int)in_stack_fffffffffffffab8,
                 (int)((ulong)pFVar10 >> 0x20),(int)pFVar10,(int)in_stack_fffffffffffffae0,
                 in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0);
      anon_unknown_2::copyMultiFabToMultiCutFab(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0)
      ;
      MultiFab::~MultiFab((MultiFab *)0x14a532c);
    }
    PVar7 = Geometry::periodicity(in_stack_fffffffffffffa90);
    flags_ = (uchar)((ulong)in_stack_fffffffffffffa80 >> 0x38);
    local_2f8.vect._0_8_ = PVar7.period.vect._0_8_;
    local_2e4._0_4_ = local_2f8.vect[0];
    local_2e4._4_4_ = local_2f8.vect[1];
    local_2f8.vect[2] = PVar7.period.vect[2];
    local_2dc = local_2f8.vect[2];
    local_2f8 = PVar7.period.vect;
    Periodicity::shiftIntVect((Periodicity *)in_stack_fffffffffffffab8);
    local_2c0 = local_2d8;
    bVar2 = BoxArray::empty((BoxArray *)0x14a540e);
    if (!bVar2) {
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )0x14a5423);
      uVar9 = 0;
      ppMVar5 = std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                          ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                           (size_type)in_stack_fffffffffffffa58);
      MultiCutFab::data(*ppMVar5);
      MFIter::MFIter((MFIter *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,flags_);
      while (bVar2 = MFIter::isValid(&local_370), bVar2) {
        std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                   (size_type)in_stack_fffffffffffffa58);
        bVar2 = MultiCutFab::ok(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        if (bVar2) {
          std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                     (size_type)in_stack_fffffffffffffa58);
          pBVar6 = (BaseFab<double> *)
                   MultiCutFab::operator[](in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
          local_a8 = BaseFab<double>::box(pBVar6);
          local_394._0_8_ = *(undefined8 *)(local_a8->smallend).vect;
          local_394._8_8_ = *(undefined8 *)((local_a8->smallend).vect + 2);
          local_394._16_8_ = *(undefined8 *)((local_a8->bigend).vect + 1);
          uVar1 = (local_a8->btype).itype;
          pBVar6 = (BaseFab<double> *)local_394;
          for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
            local_38 = local_394 + 0x18;
            local_3c = local_4c;
            local_1c = local_4c;
            local_c = local_4c;
            if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) != 0) {
              local_28 = local_394 + 0xc;
              local_2c = local_4c;
              local_30 = 0xffffffff;
              *(int *)(local_28 + (long)local_4c * 4) = *(int *)(local_28 + (long)local_4c * 4) + -1
              ;
            }
            local_18 = local_38;
          }
          local_8 = local_394 + 0x18;
          local_394._24_4_ = 0;
          local_394._28_8_ = local_394;
          local_48 = pBVar6;
          std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                     (size_type)in_stack_fffffffffffffa58);
          MultiCutFab::array(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
          local_3a0 = local_3e0;
          std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                     (size_type)in_stack_fffffffffffffa58);
          MultiCutFab::array(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
          local_3e8 = local_428;
          std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                     (size_type)in_stack_fffffffffffffa58);
          MultiCutFab::array(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
          local_478 = local_2c0;
          local_480._M_current =
               (IntVect *)
               std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                         ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffffa58);
          local_488 = (IntVect *)
                      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                                ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 in_stack_fffffffffffffa58);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                     *)in_stack_fffffffffffffa60,
                                    (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                     *)in_stack_fffffffffffffa58), bVar2) {
            local_490 = __gnu_cxx::
                        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                        ::operator*(&local_480);
            bx_00 = (Box *)&in_RDI->m_covered_grids;
            x = local_4ac;
            Box::operator+((Box *)in_stack_fffffffffffffa60,(IntVect *)in_stack_fffffffffffffa58);
            BoxArray::intersections
                      (in_stack_fffffffffffffaa0,(Box *)CONCAT44(in_stack_fffffffffffffa9c,uVar9),
                       (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)pBVar6);
            local_4b8 = local_310;
            local_4c0._M_current =
                 (pair<int,_amrex::Box> *)
                 std::
                 vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                 begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)in_stack_fffffffffffffa58);
            local_4c8 = (pair<int,_amrex::Box> *)
                        std::
                        vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ::end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                               *)in_stack_fffffffffffffa58);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                       *)in_stack_fffffffffffffa60,
                                      (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                       *)in_stack_fffffffffffffa58), bVar2) {
              local_4d0 = __gnu_cxx::
                          __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                          ::operator*(&local_4c0);
              for (local_4d4 = 0; local_4d4 < 3; local_4d4 = local_4d4 + 1) {
                Box::operator-((Box *)in_stack_fffffffffffffa60,(IntVect *)in_stack_fffffffffffffa58
                              );
                local_b0 = &stack0xfffffffffffffae8;
                local_b4 = local_4d4;
                puVar8 = local_4fc;
                local_9c = local_4d4;
                local_88 = local_4e4;
                local_8c = local_4d4;
                local_6c = local_4d4;
                local_60 = local_4d4;
                if ((local_500 & 1 << ((byte)local_4d4 & 0x1f)) == 0) {
                  local_7c = local_4d4;
                  local_80 = 1;
                  aiStack_4f0[local_4d4] = aiStack_4f0[local_4d4] + 1;
                  local_58 = local_4e4;
                  local_5c = local_4d4;
                  local_50 = local_4d4;
                  local_78 = aiStack_4f0;
                }
                local_4e0 = local_4fc;
                local_98 = puVar8;
                local_68 = local_88;
                std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                          ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffa60,
                           (size_type)in_stack_fffffffffffffa58);
                MultiCutFab::operator[](in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                BaseFab<double>::setVal<(amrex::RunOn)1>
                          (pBVar6,x,bx_00,(int)((ulong)puVar8 >> 0x20),(int)puVar8);
              }
              __gnu_cxx::
              __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
              ::operator++(&local_4c0);
            }
            __gnu_cxx::
            __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
            ::operator++(&local_480);
          }
        }
        MFIter::operator++(&local_370);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffffa60);
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffa70);
    }
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector(in_stack_fffffffffffffa70)
    ;
  }
  return;
}

Assistant:

void
Level::fillAreaFrac (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_areafrac, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_areafrac[idim]->setVal(1.0);
        }
        return;
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        MultiCutFab& areafrac = *a_areafrac[idim];
        MultiFab tmp(areafrac.boxArray(), areafrac.DistributionMap(),
                     areafrac.nComp(), areafrac.nGrow());
        tmp.setVal(1.0);
        tmp.ParallelCopy(m_areafrac[idim],0,0,areafrac.nComp(),
                         0,areafrac.nGrow(),geom.periodicity());
        copyMultiFabToMultiCutFab(areafrac, tmp);
    }

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(a_areafrac[0]->data()); mfi.isValid(); ++mfi)
        {
            if (a_areafrac[0]->ok(mfi))
            {
                const Box& ccbx = amrex::enclosedCells((*a_areafrac[0])[mfi].box());
                AMREX_D_TERM(auto const& apx = a_areafrac[0]->array(mfi);,
                             auto const& apy = a_areafrac[1]->array(mfi);,
                             auto const& apz = a_areafrac[2]->array(mfi););
                for (const auto& iv : pshifts)
                {
                    m_covered_grids.intersections(ccbx+iv, isects);
                    for (const auto& is : isects) {
                        if (Gpu::inLaunchRegion()) {
                            const Box& bx = is.second-iv;
                            AMREX_D_TERM(const Box& xbx = amrex::surroundingNodes(bx,0);,
                                         const Box& ybx = amrex::surroundingNodes(bx,1);,
                                         const Box& zbx = amrex::surroundingNodes(bx,2););
                            amrex::ParallelFor(AMREX_D_DECL(xbx,ybx,zbx),
                              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apx(i,j,k) = 0.0;
                              }
#if (AMREX_SPACEDIM >= 2)
                            , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apy(i,j,k) = 0.0;
                              }
#if (AMREX_SPACEDIM == 3)
                            , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apz(i,j,k) = 0.0;
                              }
#endif
#endif
                            );
                        } else {
                            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                                const Box& fbx = amrex::surroundingNodes(is.second-iv,idim);
                                (*a_areafrac[idim])[mfi].setVal<RunOn::Host>(0.0, fbx, 0, 1);
                            }
                        }
                    }
                }
            }
        }
    }
}